

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O3

double av1_estimate_noise_from_single_plane_avx2
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [32];
  int iVar22;
  ulong uVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  int iVar26;
  uint8_t *puVar27;
  uint8_t *puVar28;
  long lVar29;
  int iVar30;
  int stride_0;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  uint8_t *puVar34;
  uint8_t *puVar35;
  int iVar36;
  undefined2 uVar37;
  double dVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 local_218 [32];
  long local_1f8;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  
  iVar22 = width + -1;
  uVar23 = (long)iVar22 & 0xffffffffffffffe0;
  auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  lVar29 = (long)stride;
  local_1d8 = auVar39;
  if (1 < (int)(uint)uVar23) {
    uVar37 = (undefined2)edge_thresh;
    iVar36 = stride * 2 + 1;
    uVar31 = 1;
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    local_1d8 = ZEXT1632(ZEXT816(0));
    do {
      if (height < 3) {
        local_1b8._0_16_ = ZEXT816(0);
        local_1b8 = ZEXT1632(local_1b8._0_16_);
      }
      else {
        puVar24 = src + uVar31 + lVar29;
        local_158 = *(undefined8 *)puVar24;
        uStack_150 = *(undefined8 *)(puVar24 + 8);
        uStack_148 = *(undefined8 *)(puVar24 + 0x10);
        uStack_140 = *(undefined8 *)(puVar24 + 0x18);
        auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar39 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar31 + lVar29 + 1),auVar42);
        auVar9 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar31 + lVar29 + -1),auVar42);
        auVar43 = vpaddw_avx2(auVar39,auVar9);
        auVar12 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar31 + lVar29 + 1),auVar42);
        auVar13 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar31 + lVar29 + -1),auVar42);
        auVar5 = vpaddw_avx2(auVar12,auVar13);
        auVar6 = vpsubw_avx2(auVar9,auVar39);
        auVar12 = vpsubw_avx2(auVar13,auVar12);
        auVar39 = *(undefined1 (*) [32])(src + uVar31);
        auVar13 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + uVar31 + 1),auVar42);
        auVar10 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (uVar31 - 1)),auVar42);
        auVar9 = vpaddw_avx2(auVar13,auVar10);
        auVar14 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + uVar31 + 1),auVar42);
        auVar42 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (uVar31 - 1)),auVar42);
        local_218 = vpaddw_avx2(auVar14,auVar42);
        auVar13 = vpsubw_avx2(auVar10,auVar13);
        auVar10 = vpsubw_avx2(auVar42,auVar14);
        local_1b8._0_16_ = ZEXT816(0);
        local_1b8 = ZEXT1632(local_1b8._0_16_);
        lVar32 = (ulong)(height - 1) - 1;
        iVar26 = iVar36;
        do {
          auVar21 = auVar5;
          auVar18 = auVar43;
          auVar14 = *(undefined1 (*) [32])(src + iVar26);
          auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar15 = vpunpcklbw_avx2(auVar39,auVar43);
          auVar44 = vpunpckhbw_avx2(auVar39,auVar43);
          auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar26 + -1),auVar43);
          auVar39 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar26 + -1),auVar43);
          auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar16 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar26 + 1),auVar41);
          auVar43 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar26 + 1),auVar41);
          auVar17 = vpunpcklbw_avx2(auVar14,auVar41);
          auVar11 = vpunpckhbw_avx2(auVar14,auVar41);
          auVar42 = vpsubw_avx2(auVar5,auVar16);
          auVar7 = vpsubw_avx2(auVar39,auVar43);
          auVar5 = vpaddw_avx2(auVar5,auVar16);
          auVar43 = vpaddw_avx2(auVar43,auVar39);
          auVar16 = vpsubw_avx2(auVar15,auVar17);
          auVar39 = vpaddw_avx2(auVar12,auVar12);
          auVar39 = vpaddw_avx2(auVar10,auVar39);
          auVar8 = vpsubw_avx2(local_218,auVar5);
          auVar10 = vpaddw_avx2(auVar16,auVar16);
          auVar10 = vpaddw_avx2(auVar8,auVar10);
          auVar16 = vpsubw_avx2(auVar44,auVar11);
          auVar39 = vpaddw_avx2(auVar42,auVar39);
          auVar39 = vpabsw_avx2(auVar39);
          auVar10 = vpabsw_avx2(auVar10);
          auVar10 = vpaddw_avx2(auVar39,auVar10);
          auVar39 = vpaddw_avx2(auVar6,auVar6);
          auVar39 = vpaddw_avx2(auVar39,auVar13);
          auVar8 = vpsubw_avx2(auVar9,auVar43);
          auVar13 = vpaddw_avx2(auVar16,auVar16);
          auVar13 = vpaddw_avx2(auVar13,auVar8);
          auVar39 = vpaddw_avx2(auVar7,auVar39);
          auVar39 = vpabsw_avx2(auVar39);
          auVar13 = vpabsw_avx2(auVar13);
          auVar39 = vpaddw_avx2(auVar39,auVar13);
          auVar16._2_2_ = uVar37;
          auVar16._0_2_ = uVar37;
          auVar16._4_2_ = uVar37;
          auVar16._6_2_ = uVar37;
          auVar16._8_2_ = uVar37;
          auVar16._10_2_ = uVar37;
          auVar16._12_2_ = uVar37;
          auVar16._14_2_ = uVar37;
          auVar16._16_2_ = uVar37;
          auVar16._18_2_ = uVar37;
          auVar16._20_2_ = uVar37;
          auVar16._22_2_ = uVar37;
          auVar16._24_2_ = uVar37;
          auVar16._26_2_ = uVar37;
          auVar16._28_2_ = uVar37;
          auVar16._30_2_ = uVar37;
          auVar13 = vpcmpgtw_avx2(auVar16,auVar10);
          auVar10 = vpcmpgtw_avx2(auVar16,auVar39);
          auVar39 = vpaddw_avx2(auVar10,auVar13);
          if ((((((((((((((((((((((((((((((((auVar39 >> 7 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0 &&
                                           (auVar39 >> 0xf & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar39 >> 0x17 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar39 >> 0x1f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar39 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar39 >> 0x2f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar39 >> 0x37 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar39 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar39 >> 0x47 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar39 >> 0x4f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar39 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar39 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar39 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar39 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar39 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar39 >> 0x7f,0) == '\0') &&
                            (auVar39 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar39 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar39 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar39 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar39 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar39 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar39 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0xbf,0) == '\0') &&
                    (auVar39 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar39 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar39 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar39 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar39 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar39 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              -1 < auVar39[0x1f]) {
            auVar39._8_8_ = uStack_150;
            auVar39._0_8_ = local_158;
            auVar39._16_8_ = uStack_148;
            auVar39._24_8_ = uStack_140;
          }
          else {
            auVar39 = vpaddw_avx2(auVar21,auVar15);
            auVar16 = vpaddw_avx2(auVar17,auVar39);
            auVar39 = vpaddw_avx2(auVar18,auVar44);
            auVar8 = vpaddw_avx2(auVar39,auVar11);
            auVar39._8_8_ = uStack_150;
            auVar39._0_8_ = local_158;
            auVar39._16_8_ = uStack_148;
            auVar39._24_8_ = uStack_140;
            auVar44 = vpunpcklbw_avx2(auVar39,auVar41);
            auVar11 = vpunpckhbw_avx2(auVar39,auVar41);
            auVar44 = vpsllw_avx2(auVar44,2);
            auVar44 = vpaddw_avx2(auVar44,local_218);
            auVar44 = vpaddw_avx2(auVar5,auVar44);
            auVar16 = vpaddw_avx2(auVar16,auVar16);
            auVar16 = vpsubw_avx2(auVar44,auVar16);
            auVar16 = vpabsw_avx2(auVar16);
            auVar44 = vpsllw_avx2(auVar11,2);
            auVar9 = vpaddw_avx2(auVar9,auVar44);
            auVar9 = vpaddw_avx2(auVar43,auVar9);
            auVar8 = vpaddw_avx2(auVar8,auVar8);
            auVar9 = vpsubw_avx2(auVar9,auVar8);
            auVar9 = vpabsw_avx2(auVar9);
            auVar16 = vpand_avx2(auVar13,auVar16);
            auVar8 = vpand_avx2(auVar10,auVar9);
            auVar9 = vpsubw_avx2(local_1b8,auVar13);
            local_1b8 = vpsubw_avx2(auVar9,auVar10);
            auVar9 = vpunpcklwd_avx2(auVar16,auVar41);
            auVar9 = vpaddd_avx2(auVar9,local_1d8);
            auVar13 = vpunpckhwd_avx2(auVar16,auVar41);
            auVar10 = vpunpcklwd_avx2(auVar8,auVar41);
            auVar13 = vpaddd_avx2(auVar13,auVar10);
            auVar9 = vpaddd_avx2(auVar9,auVar13);
            auVar13 = vpunpckhwd_avx2(auVar8,auVar41);
            local_1d8 = vpaddd_avx2(auVar9,auVar13);
          }
          iVar26 = iVar26 + stride;
          local_158 = auVar14._0_8_;
          uStack_150 = auVar14._8_8_;
          uStack_148 = auVar14._16_8_;
          uStack_140 = auVar14._24_8_;
          lVar32 = lVar32 + -1;
          auVar13 = auVar6;
          auVar10 = auVar12;
          auVar12 = auVar42;
          auVar9 = auVar18;
          auVar6 = auVar7;
          local_218 = auVar21;
        } while (lVar32 != 0);
      }
      auVar43 = vpunpcklwd_avx2(local_1b8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar39 = vpunpckhwd_avx2(local_1b8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar39 = vpaddd_avx2(auVar39,auVar40._0_32_);
      auVar39 = vpaddd_avx2(auVar39,auVar43);
      auVar40 = ZEXT3264(auVar39);
      uVar31 = uVar31 + 0x20;
      iVar36 = iVar36 + 0x20;
    } while (uVar31 < ((long)iVar22 & 0xffffffe0U));
  }
  if (height < 3) {
    local_1f8 = 0;
    auVar43._24_8_ = 0;
    auVar43._0_24_ = local_218._8_24_;
    local_218 = auVar43 << 0x40;
  }
  else {
    puVar24 = src + lVar29 * 2 + 2;
    puVar34 = src + lVar29 + 2;
    puVar28 = src + 2;
    auVar5._24_8_ = 0;
    auVar5._0_24_ = local_218._8_24_;
    local_218 = auVar5 << 0x40;
    uVar31 = 1;
    local_1f8 = 0;
    do {
      puVar25 = puVar24;
      puVar27 = puVar28;
      uVar33 = (long)width - 2;
      puVar35 = puVar34;
      if ((int)((uint)uVar23 | 1) < iVar22) {
        do {
          auVar43 = local_218;
          bVar2 = puVar25[uVar23 - 2];
          bVar3 = puVar25[uVar23];
          iVar36 = ((((uint)puVar27[uVar23 - 2] + (uint)bVar2) - (uint)puVar27[uVar23]) -
                   (uint)bVar3) + ((uint)puVar35[uVar23 - 2] - (uint)puVar35[uVar23]) * 2;
          iVar30 = (uint)puVar27[uVar23] + (uint)puVar27[uVar23 - 2];
          iVar26 = ((iVar30 - (uint)bVar2) - (uint)bVar3) +
                   ((uint)puVar27[uVar23 - 1] - (uint)puVar25[uVar23 - 1]) * 2;
          iVar19 = -iVar36;
          if (0 < iVar36) {
            iVar19 = iVar36;
          }
          iVar36 = -iVar26;
          if (0 < iVar26) {
            iVar36 = iVar26;
          }
          if (iVar36 + iVar19 < edge_thresh) {
            uVar1 = iVar30 + (uint)bVar2 + (uint)bVar3 +
                    ((uint)puVar27[uVar23 - 1] + (uint)puVar25[uVar23 - 1] +
                    (uint)puVar35[uVar23] + (uint)puVar35[uVar23 - 2]) * -2 +
                    (uint)puVar35[uVar23 - 1] * 4;
            uVar20 = -uVar1;
            if (0 < (int)uVar1) {
              uVar20 = uVar1;
            }
            local_1f8 = local_1f8 + (ulong)uVar20;
            iVar36 = local_218._0_4_;
            local_218._4_4_ = 0;
            local_218._0_4_ = iVar36 + 1;
            local_218._8_24_ = auVar43._8_24_;
          }
          puVar25 = puVar25 + 1;
          puVar35 = puVar35 + 1;
          puVar27 = puVar27 + 1;
          uVar33 = uVar33 - 1;
        } while (uVar23 != uVar33);
      }
      uVar31 = uVar31 + 1;
      puVar24 = puVar24 + lVar29;
      puVar34 = puVar34 + lVar29;
      puVar28 = puVar28 + lVar29;
    } while (uVar31 != height - 1);
  }
  auVar39 = vphaddd_avx2(local_1d8,auVar39);
  auVar4 = vpaddd_avx(auVar39._16_16_,auVar39._0_16_);
  auVar4 = vphaddd_avx(auVar4,auVar4);
  iVar22 = auVar4._12_4_ + local_218._0_4_;
  if (iVar22 < 0x10) {
    dVar38 = -1.0;
  }
  else {
    auVar4 = vpshufd_avx(auVar4,0x50);
    dVar38 = ((double)(local_1f8 + auVar4._0_4_) / (double)(iVar22 * 6)) * 1.25331413732;
  }
  return dVar38;
}

Assistant:

double av1_estimate_noise_from_single_plane_avx2(const uint8_t *src, int height,
                                                 int width, int stride,
                                                 int edge_thresh) {
  int count = 0;
  int64_t accum = 0;
  // w32 stores width multiple of 32.
  const int w32 = (width - 1) & ~0x1f;
  const __m256i zero = _mm256_setzero_si256();
  const __m256i edge_threshold = _mm256_set1_epi16(edge_thresh);
  __m256i num_accumulator = zero;
  __m256i sum_accumulator = zero;

  //  A | B | C
  //  D | E | F
  //  G | H | I
  // g_x = (A - C) + (G - I) + 2*(D - F)
  // g_y = (A + C) - (G + I) + 2*(B - H)
  // v   = 4*E - 2*(D+F+B+H) + (A+C+G+I)

  // Process the width multiple of 32 here.
  for (int w = 1; w < w32; w += 32) {
    int h = 1;
    const int start_idx = h * stride + w;
    const int stride_0 = start_idx - stride;

    __m256i num_accum_row_lvl = zero;
    const __m256i A = _mm256_loadu_si256((__m256i *)(&src[stride_0 - 1]));
    const __m256i C = _mm256_loadu_si256((__m256i *)(&src[stride_0 + 1]));
    const __m256i D = _mm256_loadu_si256((__m256i *)(&src[start_idx - 1]));
    const __m256i F = _mm256_loadu_si256((__m256i *)(&src[start_idx + 1]));
    __m256i B = _mm256_loadu_si256((__m256i *)(&src[stride_0]));
    __m256i E = _mm256_loadu_si256((__m256i *)(&src[start_idx]));

    const __m256i A_lo = _mm256_unpacklo_epi8(A, zero);
    const __m256i A_hi = _mm256_unpackhi_epi8(A, zero);
    const __m256i C_lo = _mm256_unpacklo_epi8(C, zero);
    const __m256i C_hi = _mm256_unpackhi_epi8(C, zero);
    const __m256i D_lo = _mm256_unpacklo_epi8(D, zero);
    const __m256i D_hi = _mm256_unpackhi_epi8(D, zero);
    const __m256i F_lo = _mm256_unpacklo_epi8(F, zero);
    const __m256i F_hi = _mm256_unpackhi_epi8(F, zero);

    __m256i sub_AC_lo = _mm256_sub_epi16(A_lo, C_lo);
    __m256i sub_AC_hi = _mm256_sub_epi16(A_hi, C_hi);
    __m256i sum_AC_lo = _mm256_add_epi16(A_lo, C_lo);
    __m256i sum_AC_hi = _mm256_add_epi16(A_hi, C_hi);
    __m256i sub_DF_lo = _mm256_sub_epi16(D_lo, F_lo);
    __m256i sub_DF_hi = _mm256_sub_epi16(D_hi, F_hi);
    __m256i sum_DF_lo = _mm256_add_epi16(D_lo, F_lo);
    __m256i sum_DF_hi = _mm256_add_epi16(D_hi, F_hi);

    for (; h < height - 1; h++) {
      __m256i sum_GI_lo, sub_GI_lo, sum_GI_hi, sub_GI_hi, gx_lo, gy_lo, gx_hi,
          gy_hi;
      const int k = h * stride + w;
      const __m256i G = _mm256_loadu_si256((__m256i *)(&src[k + stride - 1]));
      const __m256i H = _mm256_loadu_si256((__m256i *)(&src[k + stride]));
      const __m256i I = _mm256_loadu_si256((__m256i *)(&src[k + stride + 1]));

      const __m256i B_lo = _mm256_unpacklo_epi8(B, zero);
      const __m256i B_hi = _mm256_unpackhi_epi8(B, zero);
      const __m256i G_lo = _mm256_unpacklo_epi8(G, zero);
      const __m256i G_hi = _mm256_unpackhi_epi8(G, zero);
      const __m256i I_lo = _mm256_unpacklo_epi8(I, zero);
      const __m256i I_hi = _mm256_unpackhi_epi8(I, zero);
      const __m256i H_lo = _mm256_unpacklo_epi8(H, zero);
      const __m256i H_hi = _mm256_unpackhi_epi8(H, zero);

      sub_GI_lo = _mm256_sub_epi16(G_lo, I_lo);
      sub_GI_hi = _mm256_sub_epi16(G_hi, I_hi);
      sum_GI_lo = _mm256_add_epi16(G_lo, I_lo);
      sum_GI_hi = _mm256_add_epi16(G_hi, I_hi);
      const __m256i sub_BH_lo = _mm256_sub_epi16(B_lo, H_lo);
      const __m256i sub_BH_hi = _mm256_sub_epi16(B_hi, H_hi);

      CALC_X_GRADIENT(sub_AC_lo, sub_GI_lo, sub_DF_lo, gx_lo)
      CALC_Y_GRADIENT(sum_AC_lo, sum_GI_lo, sub_BH_lo, gy_lo)

      const __m256i ga_lo = _mm256_add_epi16(gx_lo, gy_lo);

      CALC_X_GRADIENT(sub_AC_hi, sub_GI_hi, sub_DF_hi, gx_hi)
      CALC_Y_GRADIENT(sum_AC_hi, sum_GI_hi, sub_BH_hi, gy_hi)

      const __m256i ga_hi = _mm256_add_epi16(gx_hi, gy_hi);

      __m256i cmp_lo = _mm256_cmpgt_epi16(edge_threshold, ga_lo);
      __m256i cmp_hi = _mm256_cmpgt_epi16(edge_threshold, ga_hi);
      const __m256i comp_reg = _mm256_add_epi16(cmp_lo, cmp_hi);

      // v = 4*E -2*(D+F+B+H) + (A+C+G+I)
      if (_mm256_movemask_epi8(comp_reg) != 0) {
        const __m256i sum_BH_lo = _mm256_add_epi16(B_lo, H_lo);
        const __m256i sum_BH_hi = _mm256_add_epi16(B_hi, H_hi);

        // 2*(D+F+B+H)
        const __m256i sum_DFBH_lo =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_lo, sum_BH_lo), 1);
        // (A+C+G+I)
        const __m256i sum_ACGI_lo = _mm256_add_epi16(sum_AC_lo, sum_GI_lo);
        const __m256i sum_DFBH_hi =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_hi, sum_BH_hi), 1);
        const __m256i sum_ACGI_hi = _mm256_add_epi16(sum_AC_hi, sum_GI_hi);

        // Convert E register values from 8bit to 16bit
        const __m256i E_lo = _mm256_unpacklo_epi8(E, zero);
        const __m256i E_hi = _mm256_unpackhi_epi8(E, zero);

        // 4*E - 2*(D+F+B+H)+ (A+C+G+I)
        const __m256i var_lo_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_lo, 2), sum_DFBH_lo),
            sum_ACGI_lo));
        const __m256i var_hi_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_hi, 2), sum_DFBH_hi),
            sum_ACGI_hi));
        cmp_lo = _mm256_srli_epi16(cmp_lo, 15);
        cmp_hi = _mm256_srli_epi16(cmp_hi, 15);
        const __m256i var_lo = _mm256_mullo_epi16(var_lo_0, cmp_lo);
        const __m256i var_hi = _mm256_mullo_epi16(var_hi_0, cmp_hi);

        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_lo);
        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_hi);

        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_hi, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_hi, zero));
      }
      sub_AC_lo = sub_DF_lo;
      sub_AC_hi = sub_DF_hi;
      sub_DF_lo = sub_GI_lo;
      sub_DF_hi = sub_GI_hi;
      sum_AC_lo = sum_DF_lo;
      sum_AC_hi = sum_DF_hi;
      sum_DF_lo = sum_GI_lo;
      sum_DF_hi = sum_GI_hi;
      B = E;
      E = H;
    }
    const __m256i num_0 = _mm256_unpacklo_epi16(num_accum_row_lvl, zero);
    const __m256i num_1 = _mm256_unpackhi_epi16(num_accum_row_lvl, zero);
    num_accumulator =
        _mm256_add_epi32(num_accumulator, _mm256_add_epi32(num_0, num_1));
  }

  // Process the remaining width here.
  for (int h = 1; h < height - 1; ++h) {
    for (int w = w32 + 1; w < width - 1; ++w) {
      const int k = h * stride + w;

      // Compute sobel gradients
      const int g_x = (src[k - stride - 1] - src[k - stride + 1]) +
                      (src[k + stride - 1] - src[k + stride + 1]) +
                      2 * (src[k - 1] - src[k + 1]);
      const int g_y = (src[k - stride - 1] - src[k + stride - 1]) +
                      (src[k - stride + 1] - src[k + stride + 1]) +
                      2 * (src[k - stride] - src[k + stride]);
      const int ga = abs(g_x) + abs(g_y);

      if (ga < edge_thresh) {
        // Find Laplacian
        const int v =
            4 * src[k] -
            2 * (src[k - 1] + src[k + 1] + src[k - stride] + src[k + stride]) +
            (src[k - stride - 1] + src[k - stride + 1] + src[k + stride - 1] +
             src[k + stride + 1]);
        accum += abs(v);
        ++count;
      }
    }
  }

  // s0 s1 n0 n1 s2 s3 n2 n3
  __m256i sum_avx = _mm256_hadd_epi32(sum_accumulator, num_accumulator);
  __m128i sum_avx_lo = _mm256_castsi256_si128(sum_avx);
  __m128i sum_avx_hi = _mm256_extractf128_si256(sum_avx, 1);
  // s0+s2 s1+s3 n0+n2 n1+n3
  __m128i sum_avx_1 = _mm_add_epi32(sum_avx_lo, sum_avx_hi);
  // s0+s2+s1+s3 n0+n2+n1+n3
  __m128i result = _mm_add_epi32(_mm_srli_si128(sum_avx_1, 4), sum_avx_1);

  accum += _mm_cvtsi128_si32(result);
  count += _mm_extract_epi32(result, 2);

  // If very few smooth pels, return -1 since the estimate is unreliable.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}